

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O0

bool __thiscall
anurbs::TypeEntry<anurbs::Brep,_anurbs::Model>::load
          (TypeEntry<anurbs::Brep,_anurbs::Model> *this,Model *model,Json *source)

{
  ulong uVar1;
  element_type *this_00;
  Ref<anurbs::Brep> local_c8;
  shared_ptr<anurbs::Brep> local_b8;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  Ref<anurbs::Brep> ref;
  undefined1 local_58 [16];
  Pointer<anurbs::Brep> data;
  string key;
  Json *source_local;
  Model *model_local;
  TypeEntry<anurbs::Brep,_anurbs::Model> *this_local;
  
  key_from_json((string *)
                &data.super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                source);
  Brep::load((Brep *)local_58,model,source);
  std::shared_ptr<anurbs::Brep>::shared_ptr<anurbs::Brep,std::default_delete<anurbs::Brep>,void>
            ((shared_ptr<anurbs::Brep> *)(local_58 + 8),
             (unique_ptr<anurbs::Brep,_std::default_delete<anurbs::Brep>_> *)local_58);
  std::unique_ptr<anurbs::Brep,_std::default_delete<anurbs::Brep>_>::~unique_ptr
            ((unique_ptr<anurbs::Brep,_std::default_delete<anurbs::Brep>_> *)local_58);
  Ref<anurbs::Brep>::Ref((Ref<anurbs::Brep> *)(local_88 + 0x10));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::shared_ptr<anurbs::Brep>::shared_ptr(&local_b8,(shared_ptr<anurbs::Brep> *)(local_58 + 8));
    Model::add<anurbs::Brep>
              ((Model *)local_a8,(string *)model,
               (Pointer<anurbs::Brep> *)
               &data.super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Ref<anurbs::Brep>::operator=
              ((Ref<anurbs::Brep> *)(local_88 + 0x10),(Ref<anurbs::Brep> *)local_a8);
    Ref<anurbs::Brep>::~Ref((Ref<anurbs::Brep> *)local_a8);
    std::shared_ptr<anurbs::Brep>::~shared_ptr(&local_b8);
  }
  else {
    std::shared_ptr<anurbs::Brep>::shared_ptr
              ((shared_ptr<anurbs::Brep> *)(local_a8 + 0x10),
               (shared_ptr<anurbs::Brep> *)(local_58 + 8));
    Model::add<anurbs::Brep>((Model *)local_88,(Pointer<anurbs::Brep> *)model);
    Ref<anurbs::Brep>::operator=
              ((Ref<anurbs::Brep> *)(local_88 + 0x10),(Ref<anurbs::Brep> *)local_88);
    Ref<anurbs::Brep>::~Ref((Ref<anurbs::Brep> *)local_88);
    std::shared_ptr<anurbs::Brep>::~shared_ptr((shared_ptr<anurbs::Brep> *)(local_a8 + 0x10));
  }
  Ref<anurbs::Brep>::attributes(&local_c8);
  this_00 = std::__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&local_c8);
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (this_00,model,source);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)&local_c8);
  Ref<anurbs::Brep>::~Ref((Ref<anurbs::Brep> *)(local_88 + 0x10));
  std::shared_ptr<anurbs::Brep>::~shared_ptr((shared_ptr<anurbs::Brep> *)(local_58 + 8));
  std::__cxx11::string::~string
            ((string *)
             &data.super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return true;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }